

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_zstd.c
# Opt level: O3

ssize_t zstd_filter_read(archive_read_filter *self,void **p)

{
  undefined8 *puVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  void *pvVar5;
  char *fmt;
  archive_read *a;
  ssize_t avail_in;
  ZSTD_inBuffer in;
  ZSTD_outBuffer local_68;
  ulong local_50;
  ZSTD_inBuffer local_48;
  
  puVar1 = (undefined8 *)self->data;
  local_68.dst = (void *)puVar1[1];
  local_68.size = puVar1[2];
  local_68.pos = 0;
  if (local_68.size != 0) {
    if (*(char *)((long)puVar1 + 0x21) == '\0') {
      while( true ) {
        if (*(char *)(puVar1 + 4) == '\0') {
          sVar3 = ZSTD_initDStream((ZSTD_DStream *)*puVar1);
          uVar2 = ZSTD_isError(sVar3);
          if (uVar2 != 0) {
            a = self->archive;
            pcVar4 = ZSTD_getErrorName(sVar3);
            fmt = "Error initializing zstd decompressor: %s";
            goto LAB_003b7d53;
          }
        }
        local_48.src = __archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_50);
        if ((long)local_50 < 0) {
          return local_50;
        }
        if (local_48.src == (void *)0x0 && local_50 == 0) break;
        local_48.size = local_50;
        local_48.pos = 0;
        sVar3 = ZSTD_decompressStream((ZSTD_DStream *)*puVar1,&local_68,&local_48);
        uVar2 = ZSTD_isError(sVar3);
        if (uVar2 != 0) {
          a = self->archive;
          pcVar4 = ZSTD_getErrorName(sVar3);
          fmt = "Zstd decompression failed: %s";
LAB_003b7d53:
          archive_set_error(&a->archive,-1,fmt,pcVar4);
          return -0x1e;
        }
        __archive_read_filter_consume(self->upstream,local_48.pos);
        *(bool *)(puVar1 + 4) = sVar3 != 0;
        if ((local_68.size <= local_68.pos) || (*(char *)((long)puVar1 + 0x21) != '\0'))
        goto LAB_003b7c26;
      }
      if (*(char *)(puVar1 + 4) != '\0') {
        archive_set_error(&self->archive->archive,-1,"Truncated zstd input");
        return -0x1e;
      }
      *(undefined1 *)((long)puVar1 + 0x21) = 1;
    }
    else {
      local_68.pos = 0;
    }
LAB_003b7c26:
    puVar1[3] = puVar1[3] + local_68.pos;
    if (local_68.pos != 0) {
      pvVar5 = (void *)puVar1[1];
      goto LAB_003b7c3b;
    }
  }
  local_68.pos = 0;
  pvVar5 = (void *)0x0;
LAB_003b7c3b:
  *p = pvVar5;
  return local_68.pos;
}

Assistant:

static ssize_t
zstd_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	ZSTD_outBuffer out;
	ZSTD_inBuffer in;

	state = (struct private_data *)self->data;

	out = (ZSTD_outBuffer) { state->out_block, state->out_block_size, 0 };

	/* Try to fill the output buffer. */
	while (out.pos < out.size && !state->eof) {
		if (!state->in_frame) {
			const size_t ret = ZSTD_initDStream(state->dstream);
			if (ZSTD_isError(ret)) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Error initializing zstd decompressor: %s",
				    ZSTD_getErrorName(ret));
				return (ARCHIVE_FATAL);
			}
		}
		in.src = __archive_read_filter_ahead(self->upstream, 1,
		    &avail_in);
		if (avail_in < 0) {
			return avail_in;
		}
		if (in.src == NULL && avail_in == 0) {
			if (!state->in_frame) {
				/* end of stream */
				state->eof = 1;
				break;
			} else {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Truncated zstd input");
				return (ARCHIVE_FATAL);
			}
		}
		in.size = avail_in;
		in.pos = 0;

		{
			const size_t ret =
			    ZSTD_decompressStream(state->dstream, &out, &in);

			if (ZSTD_isError(ret)) {
				archive_set_error(&self->archive->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Zstd decompression failed: %s",
				    ZSTD_getErrorName(ret));
				return (ARCHIVE_FATAL);
			}

			/* Decompressor made some progress */
			__archive_read_filter_consume(self->upstream, in.pos);

			/* ret guaranteed to be > 0 if frame isn't done yet */
			state->in_frame = (ret != 0);
		}
	}

	decompressed = out.pos;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}